

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::default_cost_type<long_double>::default_cost_type
          (default_cost_type<long_double> *this,default_cost_type<long_double> *other,int n)

{
  longdouble *__s;
  ulong __n;
  
  this->obj = other->obj;
  __n = 0xffffffffffffffff;
  if (-1 < n) {
    __n = (long)n << 4;
  }
  __s = (longdouble *)operator_new__(__n);
  memset(__s,0,__n);
  (this->linear_elements)._M_t.
  super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = __s;
  if (0 < n) {
    memmove(__s,(other->linear_elements)._M_t.
                super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                super__Head_base<0UL,_long_double_*,_false>._M_head_impl,(ulong)(uint)n << 4);
    return;
  }
  return;
}

Assistant:

default_cost_type(const default_cost_type& other, int n)
      : obj(other.obj)
      , linear_elements(std::make_unique<Float[]>(n))
    {
        std::copy_n(other.linear_elements.get(), n, linear_elements.get());
    }